

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::CallForAllHelp::CallForAllHelp(CallForAllHelp *this,string *msg,ExitCodes exit_code)

{
  undefined4 in_EDX;
  string *in_RSI;
  undefined8 *in_RDI;
  string local_70 [55];
  allocator local_39;
  string local_38 [20];
  ExitCodes in_stack_ffffffffffffffdc;
  string *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  string *this_00;
  
  this_00 = in_RSI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,"CallForAllHelp",&local_39);
  ::std::__cxx11::string::string(local_70,in_RSI);
  Success::Success((Success *)this_00,(string *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                   in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  ::std::__cxx11::string::~string(local_70);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  *in_RDI = &PTR__CallForAllHelp_001b6908;
  return;
}

Assistant:

CallForAllHelp()
        : CallForAllHelp("This should be caught in your main function, see examples", ExitCodes::Success) {}